

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperMatch.c
# Opt level: O2

int Map_MatchNodeCut(Map_Man_t *p,Map_Node_t *pNode,Map_Cut_t *pCut,int fPhase,float fWorstLimit)

{
  Map_Super_t *pMVar1;
  int iVar2;
  int iVar3;
  Map_Match_t *pM2;
  Map_Match_t *pMVar4;
  ulong uVar5;
  float fVar6;
  float local_74;
  Map_Match_t MatchBest;
  
  pM2 = pCut->M + fPhase;
  MatchBest._32_8_ = *(undefined8 *)&pCut->M[fPhase].tArrive.Worst;
  MatchBest.pSupers = pM2->pSupers;
  MatchBest.uPhase = pCut->M[fPhase].uPhase;
  MatchBest.uPhaseBest = pCut->M[fPhase].uPhaseBest;
  MatchBest.pSuperBest = pCut->M[fPhase].pSuperBest;
  MatchBest.tArrive.Rise = pCut->M[fPhase].tArrive.Rise;
  MatchBest.tArrive.Fall = pCut->M[fPhase].tArrive.Fall;
  iVar3 = 0;
  pMVar4 = pM2;
  local_74 = fWorstLimit;
  do {
    pMVar1 = pMVar4->pSupers;
    if ((pMVar1 == (Map_Super_t *)0x0) || (p->nMatches = p->nMatches + 1, iVar3 == 0x1e)) {
      pCut->M[fPhase].pSuperBest = MatchBest.pSuperBest;
      pCut->M[fPhase].tArrive.Rise = MatchBest.tArrive.Rise;
      pCut->M[fPhase].tArrive.Fall = MatchBest.tArrive.Fall;
      *(undefined8 *)&pCut->M[fPhase].tArrive.Worst = MatchBest._32_8_;
      pM2->pSupers = MatchBest.pSupers;
      pCut->M[fPhase].uPhase = MatchBest.uPhase;
      pCut->M[fPhase].uPhaseBest = MatchBest.uPhaseBest;
      if (pCut->M[fPhase].pSuperBest != (Map_Super_t *)0x0) {
        Map_TimeCutComputeArrival(pNode,pCut,fPhase,3.4028235e+37);
        if (p->fMappingMode - 2U < 2) {
          fVar6 = Map_CutGetAreaDerefed(pCut,fPhase);
        }
        else if (p->fMappingMode == 4) {
          fVar6 = Map_SwitchCutGetDerefed(pNode,pCut,fPhase);
        }
        else {
          fVar6 = Map_CutGetAreaFlow(pCut,fPhase);
        }
        pCut->M[fPhase].AreaFlow = fVar6;
      }
      return 1;
    }
    pCut->M[fPhase].pSuperBest = pMVar1;
    for (uVar5 = 0; uVar5 < *(uint *)&pMVar1->field_0x4 >> 0x1c; uVar5 = uVar5 + 1) {
      p->nPhases = p->nPhases + 1;
      pCut->M[fPhase].uPhaseBest = (uint)pMVar1->uPhases[uVar5] ^ pCut->M[fPhase].uPhase;
      iVar2 = p->fMappingMode;
      if (iVar2 - 2U < 2) {
        fVar6 = Map_CutGetAreaDerefed(pCut,fPhase);
LAB_003660cb:
        pCut->M[fPhase].AreaFlow = fVar6;
        if (fVar6 <= MatchBest.AreaFlow + p->fEpsilon) {
          Map_TimeCutComputeArrival(pNode,pCut,fPhase,local_74);
          if (pCut->M[fPhase].tArrive.Worst <= p->fEpsilon + local_74) {
LAB_0036610e:
            iVar2 = Map_MatchCompare(p,&MatchBest,pM2,p->fMappingMode);
            if (iVar2 != 0) {
              MatchBest._32_8_ = *(undefined8 *)&pCut->M[fPhase].tArrive.Worst;
              MatchBest.pSupers = pM2->pSupers;
              MatchBest.uPhase = pCut->M[fPhase].uPhase;
              MatchBest.uPhaseBest = pCut->M[fPhase].uPhaseBest;
              MatchBest.pSuperBest = pCut->M[fPhase].pSuperBest;
              MatchBest.tArrive.Rise = pCut->M[fPhase].tArrive.Rise;
              MatchBest.tArrive.Fall = pCut->M[fPhase].tArrive.Fall;
              if (p->fMappingMode == 0) {
                local_74 = MatchBest.tArrive.Worst;
              }
            }
          }
        }
      }
      else {
        if (iVar2 == 4) {
          fVar6 = Map_SwitchCutGetDerefed(pNode,pCut,fPhase);
          goto LAB_003660cb;
        }
        if (iVar2 != 0) {
          fVar6 = Map_CutGetAreaFlow(pCut,fPhase);
          goto LAB_003660cb;
        }
        Map_TimeCutComputeArrival(pNode,pCut,fPhase,local_74);
        if (pCut->M[fPhase].tArrive.Worst <= p->fEpsilon + local_74) {
          fVar6 = Map_CutGetAreaFlow(pCut,fPhase);
          pCut->M[fPhase].AreaFlow = fVar6;
          goto LAB_0036610e;
        }
      }
    }
    pMVar4 = (Map_Match_t *)&pMVar1->pNext;
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

int Map_MatchNodeCut( Map_Man_t * p, Map_Node_t * pNode, Map_Cut_t * pCut, int fPhase, float fWorstLimit )
{
    Map_Match_t MatchBest, * pMatch = pCut->M + fPhase;
    Map_Super_t * pSuper;
    int i, Counter;

    // save the current match of the cut
    MatchBest = *pMatch;
    // go through the supergates
    for ( pSuper = pMatch->pSupers, Counter = 0; pSuper; pSuper = pSuper->pNext, Counter++ )
    {
        p->nMatches++;
        // this is an attempt to reduce the runtime of matching and area 
        // at the cost of rare and very minor increase in delay
        // (the supergates are sorted by increasing area)
        if ( Counter == 30 )
           break;

        // go through different phases of the given match and supergate
        pMatch->pSuperBest = pSuper;
        for ( i = 0; i < (int)pSuper->nPhases; i++ )
        {
            p->nPhases++;
            // find the overall phase of this match
            pMatch->uPhaseBest = pMatch->uPhase ^ pSuper->uPhases[i];
            if ( p->fMappingMode == 0 )
            {
                // get the arrival time
                Map_TimeCutComputeArrival( pNode, pCut, fPhase, fWorstLimit );
                // skip the cut if the arrival times exceed the required times
                if ( pMatch->tArrive.Worst > fWorstLimit + p->fEpsilon )
                    continue;
                // get the area (area flow)
                pMatch->AreaFlow = Map_CutGetAreaFlow( pCut, fPhase );
            }
            else
            {
                // get the area (area flow)
                if ( p->fMappingMode == 2 || p->fMappingMode == 3 )
                    pMatch->AreaFlow = Map_CutGetAreaDerefed( pCut, fPhase );
                else if ( p->fMappingMode == 4 )
                    pMatch->AreaFlow = Map_SwitchCutGetDerefed( pNode, pCut, fPhase );
                else 
                    pMatch->AreaFlow = Map_CutGetAreaFlow( pCut, fPhase );
                // skip if the cut is too large
                if ( pMatch->AreaFlow > MatchBest.AreaFlow + p->fEpsilon )
                    continue;
                // get the arrival time
                Map_TimeCutComputeArrival( pNode, pCut, fPhase, fWorstLimit );
                // skip the cut if the arrival times exceed the required times
                if ( pMatch->tArrive.Worst > fWorstLimit + p->fEpsilon )
                    continue;
            }

            // if the cut is non-trivial, compare it
            if ( Map_MatchCompare( p, &MatchBest, pMatch, p->fMappingMode ) )
            {
                MatchBest = *pMatch;
                // if we are mapping for delay, the worst-case limit should be reduced
                if ( p->fMappingMode == 0 )
                    fWorstLimit = MatchBest.tArrive.Worst;
            }
        }
    }
    // set the best match
    *pMatch = MatchBest;

    // recompute the arrival time and area (area flow) of this cut
    if ( pMatch->pSuperBest )
    {
        Map_TimeCutComputeArrival( pNode, pCut, fPhase, MAP_FLOAT_LARGE );
        if ( p->fMappingMode == 2 || p->fMappingMode == 3 )
            pMatch->AreaFlow = Map_CutGetAreaDerefed( pCut, fPhase );
        else if ( p->fMappingMode == 4 )
            pMatch->AreaFlow = Map_SwitchCutGetDerefed( pNode, pCut, fPhase );
        else 
            pMatch->AreaFlow = Map_CutGetAreaFlow( pCut, fPhase );
    }
    return 1;
}